

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dthinker.cpp
# Opt level: O1

int DThinker::TickThinkers(FThinkerList *list,FThinkerList *dest)

{
  byte *pbVar1;
  DThinker *this;
  int iVar2;
  
  this = FThinkerList::GetHead(list);
  iVar2 = 0;
  if ((this != (DThinker *)0x0) && (iVar2 = 0, this != list->Sentinel)) {
    iVar2 = 0;
    do {
      NextToThink = this->NextThinker;
      if (((this->super_DObject).ObjectFlags & 0x100) == 0) {
        if (dest != (FThinkerList *)0x0) {
          I_Error("There is a thinker in the fresh list that has already ticked.\n");
        }
      }
      else {
        if (dest != (FThinkerList *)0x0) {
          Remove(this);
          FThinkerList::AddTail(dest,this);
        }
        (*(this->super_DObject)._vptr_DObject[8])(this);
      }
      if (((this->super_DObject).ObjectFlags & 0x20) == 0) {
        (*(this->super_DObject)._vptr_DObject[7])(this);
        pbVar1 = (byte *)((long)&(this->super_DObject).ObjectFlags + 1);
        *pbVar1 = *pbVar1 & 0xfe;
        if (GC::Threshold <= GC::AllocBytes) {
          GC::Step();
        }
      }
      iVar2 = iVar2 + 1;
      this = NextToThink;
    } while (NextToThink != list->Sentinel);
  }
  return iVar2;
}

Assistant:

int DThinker::TickThinkers (FThinkerList *list, FThinkerList *dest)
{
	int count = 0;
	DThinker *node = list->GetHead();

	if (node == NULL)
	{
		return 0;
	}

	while (node != list->Sentinel)
	{
		++count;
		NextToThink = node->NextThinker;
		if (node->ObjectFlags & OF_JustSpawned)
		{
			// Leave OF_JustSpawn set until after Tick() so the ticker can check it.
			if (dest != NULL)
			{ // Move thinker from this list to the destination list
				node->Remove();
				dest->AddTail(node);
			}
			node->PostBeginPlay();
		}
		else if (dest != NULL)
		{
			I_Error("There is a thinker in the fresh list that has already ticked.\n");
		}

		if (!(node->ObjectFlags & OF_EuthanizeMe))
		{ // Only tick thinkers not scheduled for destruction
			node->Tick();
			node->ObjectFlags &= ~OF_JustSpawned;
			GC::CheckGC();
		}
		node = NextToThink;
	}
	return count;
}